

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27],capnp::Text::Reader,kj::StringPtr&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [27],Reader *params_1,StringPtr *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined4 in_register_00000014;
  Reader *params_00;
  StringPtr *params_01;
  long lVar4;
  String argValues [3];
  String *pSVar5;
  undefined8 uVar6;
  String local_78;
  String local_60;
  String local_48;
  
  this->exception = (Exception *)0x0;
  str<char_const(&)[27]>(&local_78,(kj *)params,(char (*) [27])CONCAT44(in_register_00000014,line));
  str<capnp::Text::Reader&>(&local_60,(kj *)params_1,params_00);
  str<kj::StringPtr&>(&local_48,(kj *)params_2,params_01);
  pSVar5 = &local_78;
  uVar6 = 3;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x30;
  do {
    lVar1 = *(long *)((long)&local_78.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_78.content.size_ + lVar4);
      *(undefined8 *)((long)&local_78.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_78.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_78.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,pSVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}